

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes LzmaDec_DecodeToDic(CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt16 *pUVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  uint uVar7;
  ELzmaDummy EVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Byte *pBVar13;
  uint uVar14;
  long lVar15;
  SizeT inSize;
  ulong uVar16;
  bool bVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar40;
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar47 [16];
  long lVar22;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  uVar7 = p->remainLen;
  if (uVar7 != 0x112) {
    buf = p->tempBuf;
    do {
      auVar5 = _DAT_0011dfc0;
      if (p->needFlush != 0) {
        uVar9 = p->tempBufSize;
        if (inSize == 0) {
          inSize = 0;
        }
        else {
          uVar11 = 5;
          if (5 < uVar9) {
            uVar11 = (ulong)uVar9;
          }
          if (uVar9 < 5) {
            lVar22 = inSize - 1;
            lVar6 = 0;
            do {
              lVar15 = lVar6;
              BVar1 = src[lVar15];
              p->tempBufSize = uVar9 + (int)lVar15 + 1;
              buf[lVar15 + (ulong)uVar9] = BVar1;
              *srcLen = *srcLen + 1;
              if (lVar22 == lVar15) {
                inSize = 0;
                break;
              }
              inSize = inSize - 1;
              lVar6 = lVar15 + 1;
            } while (uVar11 - uVar9 != lVar15 + 1);
            src = src + lVar15 + 1;
            uVar9 = uVar9 + (int)lVar15 + 1;
          }
        }
        if (uVar9 < 5) goto LAB_00112aa7;
        if (*buf != '\0') {
          return 1;
        }
        uVar9 = *(uint *)(p->tempBuf + 1);
        p->code = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }
      uVar11 = p->dicPos;
      if (dicLimit <= uVar11) {
        if (uVar7 != 0) {
          if (finishMode == LZMA_FINISH_ANY) {
LAB_00112a6c:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 0;
          }
          goto LAB_00112a5a;
        }
        if (p->code == 0) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return 0;
        }
        if (finishMode == LZMA_FINISH_ANY) goto LAB_00112a6c;
      }
      if (p->needInitState != 0) {
        uVar7 = 0x300 << ((char)(p->prop).lp + (char)(p->prop).lc & 0x1fU);
        pUVar2 = p->probs;
        lVar22 = (ulong)uVar7 + 0x735;
        auVar18._8_4_ = (int)lVar22;
        auVar18._0_8_ = lVar22;
        auVar18._12_4_ = (int)((ulong)lVar22 >> 0x20);
        auVar18 = auVar18 ^ auVar5;
        uVar12 = 0;
        auVar21 = _DAT_0011dfa0;
        auVar23 = _DAT_0011df90;
        auVar24 = _DAT_0011df80;
        auVar25 = _DAT_0011df70;
        do {
          auVar26 = auVar21 ^ auVar5;
          iVar40 = auVar18._0_4_;
          iVar39 = -(uint)(iVar40 < auVar26._0_4_);
          iVar19 = auVar18._4_4_;
          auVar27._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
          iVar44 = auVar18._8_4_;
          iVar43 = -(uint)(iVar44 < auVar26._8_4_);
          iVar20 = auVar18._12_4_;
          auVar27._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
          auVar36._4_4_ = iVar39;
          auVar36._0_4_ = iVar39;
          auVar36._8_4_ = iVar43;
          auVar36._12_4_ = iVar43;
          auVar45 = pshuflw(in_XMM8,auVar36,0xe8);
          auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
          auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
          auVar29._0_4_ = auVar29._4_4_;
          auVar29._8_4_ = auVar29._12_4_;
          auVar47 = pshuflw(in_XMM9,auVar29,0xe8);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar46 = pshuflw(auVar45,auVar27,0xe8);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar26 = (auVar46 | auVar47 & auVar45) ^ auVar26;
          auVar26 = packssdw(auVar26,auVar26);
          if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar2[uVar12] = 0x400;
          }
          auVar27 = auVar29 & auVar36 | auVar27;
          auVar26 = packssdw(auVar27,auVar27);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
          if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
            pUVar2[uVar12 + 1] = 0x400;
          }
          auVar26 = auVar23 ^ auVar5;
          iVar39 = -(uint)(iVar40 < auVar26._0_4_);
          auVar41._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
          iVar43 = -(uint)(iVar44 < auVar26._8_4_);
          auVar41._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
          auVar28._4_4_ = iVar39;
          auVar28._0_4_ = iVar39;
          auVar28._8_4_ = iVar43;
          auVar28._12_4_ = iVar43;
          auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
          auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar26 = auVar35 & auVar28 | auVar41;
          auVar26 = packssdw(auVar26,auVar26);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar26 = packssdw(auVar26 ^ auVar3,auVar26 ^ auVar3);
          if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 2] = 0x400;
          }
          auVar29 = pshufhw(auVar28,auVar28,0x84);
          auVar36 = pshufhw(auVar35,auVar35,0x84);
          auVar27 = pshufhw(auVar29,auVar41,0x84);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
          auVar29 = packssdw(auVar30,auVar30);
          if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 3] = 0x400;
          }
          auVar29 = auVar24 ^ auVar5;
          iVar39 = -(uint)(iVar40 < auVar29._0_4_);
          auVar32._4_4_ = -(uint)(iVar19 < auVar29._4_4_);
          iVar43 = -(uint)(iVar44 < auVar29._8_4_);
          auVar32._12_4_ = -(uint)(iVar20 < auVar29._12_4_);
          auVar37._4_4_ = iVar39;
          auVar37._0_4_ = iVar39;
          auVar37._8_4_ = iVar43;
          auVar37._12_4_ = iVar43;
          auVar26 = pshuflw(auVar26,auVar37,0xe8);
          auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar19);
          auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar20);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          in_XMM9 = pshuflw(auVar47 & auVar45,auVar31,0xe8);
          in_XMM9 = in_XMM9 & auVar26;
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar26 = pshuflw(auVar26,auVar32,0xe8);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar26 | in_XMM9) ^ auVar45;
          auVar26 = packssdw(auVar45,auVar45);
          if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 4] = 0x400;
          }
          auVar32 = auVar31 & auVar37 | auVar32;
          auVar26 = packssdw(auVar32,auVar32);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar26 = packssdw(auVar26 ^ auVar47,auVar26 ^ auVar47);
          if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 5] = 0x400;
          }
          auVar26 = auVar25 ^ auVar5;
          iVar40 = -(uint)(iVar40 < auVar26._0_4_);
          auVar42._4_4_ = -(uint)(iVar19 < auVar26._4_4_);
          iVar44 = -(uint)(iVar44 < auVar26._8_4_);
          auVar42._12_4_ = -(uint)(iVar20 < auVar26._12_4_);
          auVar33._4_4_ = iVar40;
          auVar33._0_4_ = iVar40;
          auVar33._8_4_ = iVar44;
          auVar33._12_4_ = iVar44;
          auVar38._4_4_ = -(uint)(auVar26._4_4_ == iVar19);
          auVar38._12_4_ = -(uint)(auVar26._12_4_ == iVar20);
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar26 = auVar38 & auVar33 | auVar42;
          auVar26 = packssdw(auVar26,auVar26);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar26 ^ auVar4,auVar26 ^ auVar4);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 6] = 0x400;
          }
          auVar26 = pshufhw(auVar33,auVar33,0x84);
          auVar27 = pshufhw(auVar38,auVar38,0x84);
          auVar29 = pshufhw(auVar26,auVar42,0x84);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar34 = (auVar29 | auVar27 & auVar26) ^ auVar34;
          auVar26 = packssdw(auVar34,auVar34);
          if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar2[uVar12 + 7] = 0x400;
          }
          uVar12 = uVar12 + 8;
          lVar22 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 8;
          auVar21._8_8_ = lVar22 + 8;
          lVar22 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 8;
          auVar23._8_8_ = lVar22 + 8;
          lVar22 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 8;
          auVar24._8_8_ = lVar22 + 8;
          lVar22 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 8;
          auVar25._8_8_ = lVar22 + 8;
        } while (((ulong)(uVar7 + 0x700) | 0x38) != uVar12);
        p->reps[3] = 1;
        p->state = 0;
        p->reps[0] = 1;
        p->reps[1] = 1;
        p->reps[2] = 1;
        p->needInitState = 0;
      }
      uVar7 = p->tempBufSize;
      uVar12 = (ulong)uVar7;
      if (uVar12 == 0) {
        if (inSize < 0x14 || dicLimit <= uVar11) {
          EVar8 = LzmaDec_TryDummy(p,src,inSize);
          if (EVar8 == DUMMY_ERROR) {
            memcpy(buf,src,inSize);
            p->tempBufSize = (uint)inSize;
            *srcLen = *srcLen + inSize;
            goto LAB_00112aa7;
          }
          pBVar13 = src;
          if ((dicLimit <= uVar11) && (EVar8 != DUMMY_MATCH)) goto LAB_00112a5a;
        }
        else {
          pBVar13 = src + (inSize - 0x14);
        }
        p->buf = src;
        iVar40 = LzmaDec_DecodeReal2(p,dicLimit,pBVar13);
        if (iVar40 != 0) {
          return 1;
        }
        uVar11 = (long)p->buf - (long)src;
        *srcLen = *srcLen + uVar11;
      }
      else {
        uVar9 = 0;
        bVar17 = uVar7 < 0x14;
        if (bVar17) {
          uVar16 = 0;
          if (inSize != 0) {
            uVar16 = 0;
            do {
              pBVar13 = src + uVar16;
              uVar16 = uVar16 + 1;
              buf[uVar12] = *pBVar13;
              bVar17 = uVar12 < 0x13;
              if (!bVar17) break;
              uVar12 = uVar12 + 1;
            } while (uVar16 < inSize);
            uVar9 = (uint)uVar16;
            uVar12 = (ulong)(uVar7 + uVar9);
          }
        }
        else {
          uVar16 = 0;
        }
        uVar7 = (uint)uVar12;
        p->tempBufSize = uVar7;
        if (!(bool)(uVar11 < dicLimit & (bVar17 ^ 1U))) {
          EVar8 = LzmaDec_TryDummy(p,buf,uVar12);
          if (EVar8 == DUMMY_ERROR) {
            *srcLen = *srcLen + uVar16;
LAB_00112aa7:
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return 0;
          }
          if ((dicLimit <= uVar11) && (EVar8 != DUMMY_MATCH)) {
LAB_00112a5a:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 1;
          }
        }
        p->buf = buf;
        iVar40 = LzmaDec_DecodeReal2(p,dicLimit,buf);
        if (iVar40 != 0) {
          return 1;
        }
        uVar10 = *(int *)&p->buf - (int)buf;
        uVar14 = uVar7 - uVar10;
        if (uVar7 < uVar10) {
          return 0xb;
        }
        uVar11 = (ulong)(uVar9 - uVar14);
        if (uVar9 < uVar14) {
          return 0xb;
        }
        *srcLen = *srcLen + uVar11;
        p->tempBufSize = 0;
      }
      src = src + uVar11;
      inSize = inSize - uVar11;
      uVar7 = p->remainLen;
    } while (uVar7 != 0x112);
  }
  uVar7 = 1;
  if (p->code == 0) {
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
    uVar7 = (uint)(p->code != 0);
  }
  return uVar7;
}

Assistant:

static SRes LzmaDec_DecodeToDic(CLzmaDec *p, SizeT dicLimit, const Byte *src, SizeT *srcLen,
    ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);
  
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart)
  {
      int checkEndMarkNow;

      if (p->needFlush)
      {
        for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
          p->tempBuf[p->tempBufSize++] = *src++;
        if (p->tempBufSize < RC_INIT_SIZE)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (p->tempBuf[0] != 0)
          return SZ_ERROR_DATA;
        p->code =
              ((UInt32)p->tempBuf[1] << 24)
            | ((UInt32)p->tempBuf[2] << 16)
            | ((UInt32)p->tempBuf[3] << 8)
            | ((UInt32)p->tempBuf[4]);
        p->range = 0xFFFFFFFF;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }

      checkEndMarkNow = 0;
      if (p->dicPos >= dicLimit)
      {
        if (p->remainLen == 0 && p->code == 0)
        {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return SZ_OK;
        }
        if (finishMode == LZMA_FINISH_ANY)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_OK;
        }
        if (p->remainLen != 0)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        checkEndMarkNow = 1;
      }

      if (p->needInitState)
        LzmaDec_InitStateReal(p);
  
      if (p->tempBufSize == 0)
      {
        SizeT processed;
        const Byte *bufLimit;
        if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, src, inSize);
          if (dummyRes == DUMMY_ERROR)
          {
            memcpy(p->tempBuf, src, inSize);
            p->tempBufSize = (unsigned)inSize;
            (*srcLen) += inSize;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
          bufLimit = src;
        }
        else
          bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
        p->buf = src;
        if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
          return SZ_ERROR_DATA;
        processed = (SizeT)(p->buf - src);
        (*srcLen) += processed;
        src += processed;
        inSize -= processed;
      }
      else
      {
        unsigned rem = p->tempBufSize, lookAhead = 0;
        while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
          p->tempBuf[rem++] = src[lookAhead++];
        p->tempBufSize = rem;
        if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
          if (dummyRes == DUMMY_ERROR)
          {
            (*srcLen) += lookAhead;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
        }
        p->buf = p->tempBuf;
        if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
          return SZ_ERROR_DATA;
        
        {
          unsigned kkk = (unsigned)(p->buf - p->tempBuf);
          if (rem < kkk)
            return SZ_ERROR_FAIL; /* some internal error */
          rem -= kkk;
          if (lookAhead < rem)
            return SZ_ERROR_FAIL; /* some internal error */
          lookAhead -= rem;
        }
        (*srcLen) += lookAhead;
        src += lookAhead;
        inSize -= lookAhead;
        p->tempBufSize = 0;
      }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}